

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrGetEnvironmentDepthSwapchainStateMETA
                   (XrEnvironmentDepthSwapchainMETA swapchain,
                   XrEnvironmentDepthSwapchainStateMETA *state)

{
  long lVar1;
  XrResult XVar2;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  __hash_code __code;
  _Hash_node_base *p_Var6;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_state;
  ostringstream oss_swapchain;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [3];
  ios_base local_2a0 [264];
  unique_lock<std::mutex> local_198;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  local_368.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_device = &g_environmentdepthswapchainmeta_dispatch_mutex;
  local_198._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_198);
  local_198._M_owns = true;
  p_Var3 = g_environmentdepthswapchainmeta_dispatch_map._M_h._M_buckets
           [(ulong)swapchain % g_environmentdepthswapchainmeta_dispatch_map._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var3->_M_nxt, p_Var4 = p_Var3,
     (XrEnvironmentDepthSwapchainMETA)p_Var3->_M_nxt[1]._M_nxt != swapchain)) {
    while (p_Var3 = p_Var5, p_Var5 = p_Var3->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt %
           g_environmentdepthswapchainmeta_dispatch_map._M_h._M_bucket_count !=
           (ulong)swapchain % g_environmentdepthswapchainmeta_dispatch_map._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, (XrEnvironmentDepthSwapchainMETA)p_Var5[1]._M_nxt == swapchain))
      goto LAB_0025ce1e;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_0025ce1e:
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var4->_M_nxt;
  }
  if (p_Var5 == (_Hash_node_base *)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var5[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_198);
  if (p_Var5 == (_Hash_node_base *)0x0) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[40],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_368,(char (*) [9])"XrResult",
               (char (*) [40])"xrGetEnvironmentDepthSwapchainStateMETA",(char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    lVar1 = *(long *)((long)&local_198._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_180 + lVar1) = *(uint *)((long)auStack_180 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_198);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[32],char_const(&)[10],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_368,(char (*) [32])"XrEnvironmentDepthSwapchainMETA",
               (char (*) [10])"swapchain",local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310[0]._M_dataplus._M_p != &local_310[0].field_2) {
      operator_delete(local_310[0]._M_dataplus._M_p,local_310[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
    *(uint *)((long)&local_310[0].field_2 + *(long *)(local_310[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_310[0].field_2 +
                  *(long *)(local_310[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_310);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[38],char_const(&)[6],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_368,(char (*) [38])0x2abd2e,(char (*) [6])"state",&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_328,&local_368);
    ApiDumpLayerRecordContent(&local_328);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_328);
    XVar2 = (*(code *)p_Var6[0x103]._M_nxt)(swapchain,state);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    std::ios_base::~ios_base(local_2a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_368);
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrGetEnvironmentDepthSwapchainStateMETA(
    XrEnvironmentDepthSwapchainMETA swapchain,
    XrEnvironmentDepthSwapchainStateMETA* state) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_environmentdepthswapchainmeta_dispatch_mutex);
            auto map_iter = g_environmentdepthswapchainmeta_dispatch_map.find(swapchain);
            if (map_iter == g_environmentdepthswapchainmeta_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrGetEnvironmentDepthSwapchainStateMETA", "");
        std::ostringstream oss_swapchain;
        oss_swapchain << std::hex << reinterpret_cast<const void*>(swapchain);
        contents.emplace_back("XrEnvironmentDepthSwapchainMETA", "swapchain", oss_swapchain.str());
        std::ostringstream oss_state;
        oss_state << std::hex << reinterpret_cast<const void*>(state);
        contents.emplace_back("XrEnvironmentDepthSwapchainStateMETA*", "state", oss_state.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->GetEnvironmentDepthSwapchainStateMETA(swapchain, state);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}